

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O0

void slang::
     function_ref<void(slang::ast::Compilation&,slang::ast::ClassType&,slang::SourceLocation)>::
     callback_fn<slang::ast::builtins::createMailboxClass(slang::ast::Compilation&)::__0>
               (intptr_t callable,Compilation *params,ClassType *params_1,SourceLocation params_2)

{
  ClassType *in_stack_000004d8;
  Compilation *in_stack_000004e0;
  anon_class_1_0_00000001 *in_stack_000004e8;
  SourceLocation in_stack_000004f0;
  
  ast::builtins::createMailboxClass::anon_class_1_0_00000001::operator()
            (in_stack_000004e8,in_stack_000004e0,in_stack_000004d8,in_stack_000004f0);
  return;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }